

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void arm_rebuild_hflags_arm(CPUARMState *env)

{
  uint32_t uVar1;
  CPUARMState *env_local;
  
  uVar1 = rebuild_hflags_internal(env);
  env->hflags = uVar1;
  return;
}

Assistant:

void arm_rebuild_hflags(CPUARMState *env)
{
    env->hflags = rebuild_hflags_internal(env);
}